

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseDocTypeDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *URI;
  xmlChar *ExternalID;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  ExternalID = (xmlChar *)0x0;
  URI = (xmlChar *)0x0;
  ctxt->input->cur = ctxt->input->cur + 9;
  ctxt->input->col = ctxt->input->col + 9;
  name = (xmlChar *)ctxt;
  if (*ctxt->input->cur == '\0') {
    xmlParserGrow(ctxt);
  }
  iVar1 = xmlSkipBlankChars((xmlParserCtxtPtr)name);
  if (iVar1 == 0) {
    xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                   "Space required after \'DOCTYPE\'\n");
  }
  ExternalID = xmlParseName((xmlParserCtxtPtr)name);
  if (ExternalID == (xmlChar *)0x0) {
    xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_NAME_REQUIRED,
                   "xmlParseDocTypeDecl : no DOCTYPE name !\n");
  }
  *(xmlChar **)(name + 0x158) = ExternalID;
  xmlSkipBlankChars((xmlParserCtxtPtr)name);
  pxVar2 = xmlParseExternalID((xmlParserCtxtPtr)name,&URI,1);
  if ((pxVar2 != (xmlChar *)0x0) || (URI != (xmlChar *)0x0)) {
    name[0x8c] = '\x01';
    name[0x8d] = '\0';
    name[0x8e] = '\0';
    name[0x8f] = '\0';
  }
  *(xmlChar **)(name + 0x160) = pxVar2;
  *(xmlChar **)(name + 0x168) = URI;
  xmlSkipBlankChars((xmlParserCtxtPtr)name);
  if (((*(long *)name != 0) && (**(long **)name != 0)) && (*(int *)(name + 0x14c) == 0)) {
    (*(code *)**(undefined8 **)name)(*(undefined8 *)(name + 8),ExternalID,URI,pxVar2);
  }
  if ((**(char **)(*(long *)(name + 0x38) + 0x20) != '[') &&
     (**(char **)(*(long *)(name + 0x38) + 0x20) != '>')) {
    xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
  }
  return;
}

Assistant:

void
xmlParseDocTypeDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name = NULL;
    xmlChar *ExternalID = NULL;
    xmlChar *URI = NULL;

    /*
     * We know that '<!DOCTYPE' has been detected.
     */
    SKIP(9);

    if (SKIP_BLANKS == 0) {
        xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
                       "Space required after 'DOCTYPE'\n");
    }

    /*
     * Parse the DOCTYPE name.
     */
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseDocTypeDecl : no DOCTYPE name !\n");
    }
    ctxt->intSubName = name;

    SKIP_BLANKS;

    /*
     * Check for SystemID and ExternalID
     */
    URI = xmlParseExternalID(ctxt, &ExternalID, 1);

    if ((URI != NULL) || (ExternalID != NULL)) {
        ctxt->hasExternalSubset = 1;
    }
    ctxt->extSubURI = URI;
    ctxt->extSubSystem = ExternalID;

    SKIP_BLANKS;

    /*
     * Create and update the internal subset.
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->internalSubset != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->internalSubset(ctxt->userData, name, ExternalID, URI);

    if ((RAW != '[') && (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
    }
}